

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_number_isInteger(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue val;
  JSValue JVar1;
  int iVar2;
  undefined4 in_ECX;
  int64_t in_RDI;
  JSContext *in_R8;
  int ret;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  val.u._4_4_ = in_ECX;
  val.u.int32 = in_stack_ffffffffffffffb0;
  val.tag = in_RDI;
  iVar2 = JS_NumberIsInteger(in_R8,val);
  if (iVar2 < 0) {
    local_30 = 0;
    local_28 = 6;
  }
  else {
    local_30 = (uint)(iVar2 != 0);
    uStack_2c = uStack_c;
    local_28 = 1;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_number_isInteger(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv)
{
    int ret;
    ret = JS_NumberIsInteger(ctx, argv[0]);
    if (ret < 0)
        return JS_EXCEPTION;
    else
        return JS_NewBool(ctx, ret);
}